

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O3

void __thiscall cppcms::rpc::json_rpc_server::main(json_rpc_server *this,string param_1)

{
  shared_ptr<cppcms::rpc::json_call> *this_00;
  element_type *peVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  level_type lVar6;
  _Rb_tree_color _Var7;
  request *this_01;
  json_call *this_02;
  context *pcVar8;
  ostream *poVar9;
  iterator iVar10;
  response *prVar11;
  undefined1 local_80 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  
  if ((this->smd_)._M_string_length != 0) {
    this_01 = application::request(&this->super_application);
    http::request::request_method_abi_cxx11_((string *)local_80,this_01);
    iVar5 = std::__cxx11::string::compare((char *)local_80);
    pcVar8 = (context *)(local_80 + 0x10);
    if ((context *)local_80._0_8_ != pcVar8) {
      operator_delete((void *)local_80._0_8_);
    }
    if (iVar5 == 0) {
      prVar11 = application::response(&this->super_application);
      local_80._0_8_ = pcVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"application/json","");
      http::response::set_content_header(prVar11,(string *)local_80);
      if ((context *)local_80._0_8_ != pcVar8) {
        operator_delete((void *)local_80._0_8_);
      }
      prVar11 = application::response(&this->super_application);
      poVar9 = http::response::out(prVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(this->smd_)._M_dataplus._M_p,(this->smd_)._M_string_length);
      bVar4 = application::is_asynchronous(&this->super_application);
      if (!bVar4) {
        return;
      }
      application::release_context((application *)local_80);
      http::context::async_complete_response((context *)local_80._0_8_);
      if ((_data *)local_80._8_8_ == (_data *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      return;
    }
  }
  this_02 = (json_call *)operator_new(0x60);
  pcVar8 = application::context(&this->super_application);
  json_call::json_call(this_02,pcVar8);
  this_00 = &this->current_call_;
  std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::
  reset<cppcms::rpc::json_call>
            (&this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>,
             this_02);
  lVar6 = booster::log::logger::instance();
  cVar3 = booster::log::logger::should_be_logged(lVar6,(char *)0x46);
  if (cVar3 != '\0') {
    booster::log::message::message
              ((message *)local_80,debug,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/rpc_json.cpp"
               ,0xa2);
    poVar9 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"JSON-RPC Method call:",0x15);
    check_call(this);
    peVar1 = (this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pcVar2 = (peVar1->method_)._M_dataplus._M_p;
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (peVar1->method_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)local_50,local_48);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    booster::log::message::~message((message *)local_80);
  }
  check_call(this);
  peVar1 = (this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar2 = (peVar1->method_)._M_dataplus._M_p;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar2,pcVar2 + (peVar1->method_)._M_string_length);
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
           ::find(&(this->methods_)._M_t,(key_type *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_);
  }
  if ((_Rb_tree_header *)iVar10._M_node == &(this->methods_)._M_t._M_impl.super__Rb_tree_header) {
    check_call(this);
    if (((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        notification_ != false) {
      return;
    }
    json::value::value<char[17]>((value *)local_80,(char (*) [17])"Method not found");
    return_error(this,(value *)local_80);
LAB_00214ed0:
    json::value::copyable::~copyable((copyable *)local_80);
  }
  else {
    _Var7 = iVar10._M_node[3]._M_color;
    if (_Var7 == 2) {
      check_call(this);
      if (((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->notification_ == false) {
        json::value::value<char[35]>
                  ((value *)local_80,(char (*) [35])"The request should be notification");
        return_error(this,(value *)local_80);
        goto LAB_00214ed0;
      }
      _Var7 = iVar10._M_node[3]._M_color;
    }
    if ((_Var7 == _S_black) &&
       (check_call(this),
       ((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       notification_ != false)) {
      return;
    }
    check_call(this);
    if (iVar10._M_node[2]._M_left == (_Base_ptr)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)iVar10._M_node[2]._M_right)
              (iVar10._M_node + 2,
               &((this_00->super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->params_);
  }
  return;
}

Assistant:

void json_rpc_server::main(std::string /*unused*/)
	{
		if(!smd_.empty() && request().request_method()=="GET") {

			response().set_content_header("application/json");
			response().out() << smd_;

			if(is_asynchronous())
				release_context()->async_complete_response();
			return;
		}

		try {
			current_call_.reset(new json_call(context()));
			BOOSTER_DEBUG("cppcms") << "JSON-RPC Method call:" << method();
			methods_map_type::iterator p=methods_.find(method());
			if(p==methods_.end()) {
				if(!notification())
					return_error("Method not found");
				return;
			}
			if(p->second.role == notification_role && !notification()) {
				return_error("The request should be notification");
				return;
			}
			if(p->second.role == method_role && notification()) {
				// No way to respond according to protocol
				return;
			}
			try {
				p->second.method(params());
			}
			catch(json::bad_value_cast const &e) {
				if(current_call_.get() && !notification())
					return_error("Invalid parameters");
				return;
			}
			catch(call_error const &e) {
				if(current_call_.get() && !notification())
					return_error(e.what());
				return;
			}
			catch(std::exception const &e) {
				if(current_call_.get() && !notification())
					return_error("Internal Service Error");
				return;
			}
		}
		catch(call_error const &e)
		{
			response().set_content_header("text/plain");
			response().out()<< e.what() << std::endl;
		}
	}